

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileLibraryTargetGenerator::~cmMakefileLibraryTargetGenerator
          (cmMakefileLibraryTargetGenerator *this)

{
  (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
  _vptr_cmCommonTargetGenerator = (_func_int **)&PTR__cmMakefileLibraryTargetGenerator_005c17b0;
  std::__cxx11::string::~string((string *)&this->DeviceLinkObject);
  std::__cxx11::string::~string((string *)&this->FrameworkVersion);
  cmMakefileTargetGenerator::~cmMakefileTargetGenerator(&this->super_cmMakefileTargetGenerator);
  return;
}

Assistant:

cmMakefileLibraryTargetGenerator::~cmMakefileLibraryTargetGenerator() =
  default;